

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O1

void __thiscall
NoiseModel_InitSuccessWithValidDiamondShape_Test::TestBody
          (NoiseModel_InitSuccessWithValidDiamondShape_Test *this)

{
  undefined8 *puVar1;
  int iVar2;
  pointer *__ptr;
  SEARCH_METHODS *pSVar3;
  char *in_R9;
  long lVar4;
  aom_noise_model_params_t params;
  AssertionResult gtest_ar_;
  int kCoords [6] [2];
  int kNumCoords;
  aom_noise_model_t model;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_348;
  Message local_340;
  undefined8 *local_338;
  AssertHelper local_330;
  string local_328;
  undefined8 local_308;
  undefined8 uStack_300;
  int local_2f4;
  aom_noise_model_t local_2f0;
  
  params.bit_depth = 8;
  params.use_highbd = 0;
  params.shape = '\0';
  params._1_3_ = 0;
  params.lag = 2;
  iVar2 = aom_noise_model_init(&local_2f0,params);
  local_340.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_340.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,iVar2 != 0);
  local_338 = (undefined8 *)0x0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)&local_348);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_328,(internal *)&local_340,
               (AssertionResult *)"aom_noise_model_init(&model, params)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x131,local_328._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if (local_348._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_348._M_head_impl + 8))();
    }
  }
  puVar1 = local_338;
  if (local_338 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_338 != local_338 + 2) {
      operator_delete((undefined8 *)*local_338);
    }
    operator_delete(puVar1);
  }
  local_340.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_328,"6","model.n",(int *)&local_340,&local_2f0.n);
  if ((char)local_328._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_340);
    if ((undefined8 *)local_328._M_string_length == (undefined8 *)0x0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = *(SEARCH_METHODS **)local_328._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x132,(char *)pSVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if ((long *)CONCAT44(local_340.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_340.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_340.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_340.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if ((undefined8 *)local_328._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_328._M_string_length !=
        (undefined8 *)(local_328._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_328._M_string_length);
    }
    operator_delete((void *)local_328._M_string_length);
  }
  local_2f4 = 6;
  local_308 = 0xfffffffe;
  uStack_300 = 0xffffffff;
  local_328.field_2._M_allocated_capacity = 0xffffffff00000000;
  local_328.field_2._8_8_ = 0xffffffff00000001;
  local_328._M_dataplus._M_p = (pointer)0xfffffffe00000000;
  local_328._M_string_length = 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_340,"kNumCoords","model.n",&local_2f4,&local_2f0.n);
  if (local_340.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_338 == (undefined8 *)0x0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = (SEARCH_METHODS *)*local_338;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x136,(char *)pSVar3);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_348._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_348._M_head_impl + 8))();
    }
  }
  puVar1 = local_338;
  if (local_338 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_338 != local_338 + 2) {
      operator_delete((undefined8 *)*local_338);
    }
    operator_delete(puVar1);
  }
  lVar4 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_340,"coord[0]","model.coords[i][0]",
               (int *)((long)&local_328._M_dataplus._M_p + lVar4),
               (int *)((long)*local_2f0.coords + lVar4));
    if (local_340.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_348);
      pSVar3 = "";
      if (local_338 != (undefined8 *)0x0) {
        pSVar3 = (SEARCH_METHODS *)*local_338;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_330,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x139,(char *)pSVar3);
      testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_348);
      testing::internal::AssertHelper::~AssertHelper(&local_330);
      if (local_348._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_348._M_head_impl + 8))();
      }
    }
    puVar1 = local_338;
    if (local_338 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_338 != local_338 + 2) {
        operator_delete((undefined8 *)*local_338);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_340,"coord[1]","model.coords[i][1]",
               (int *)((long)&local_328._M_dataplus._M_p + lVar4 + 4),
               (int *)((long)*local_2f0.coords + lVar4 + 4));
    if (local_340.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_348);
      pSVar3 = "";
      if (local_338 != (undefined8 *)0x0) {
        pSVar3 = (SEARCH_METHODS *)*local_338;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_330,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x13a,(char *)pSVar3);
      testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_348);
      testing::internal::AssertHelper::~AssertHelper(&local_330);
      if (local_348._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_348._M_head_impl + 8))();
      }
    }
    puVar1 = local_338;
    if (local_338 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_338 != local_338 + 2) {
        operator_delete((undefined8 *)*local_338);
      }
      operator_delete(puVar1);
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x30);
  aom_noise_model_free(&local_2f0);
  return;
}

Assistant:

TEST(NoiseModel, InitSuccessWithValidDiamondShape) {
  aom_noise_model_t model;
  aom_noise_model_params_t params = { AOM_NOISE_SHAPE_DIAMOND, 2, 8, 0 };
  EXPECT_TRUE(aom_noise_model_init(&model, params));
  EXPECT_EQ(6, model.n);
  const int kNumCoords = 6;
  const int kCoords[][2] = { { 0, -2 }, { -1, -1 }, { 0, -1 },
                             { 1, -1 }, { -2, 0 },  { -1, 0 } };
  EXPECT_EQ(kNumCoords, model.n);
  for (int i = 0; i < kNumCoords; ++i) {
    const int *coord = kCoords[i];
    EXPECT_EQ(coord[0], model.coords[i][0]);
    EXPECT_EQ(coord[1], model.coords[i][1]);
  }
  aom_noise_model_free(&model);
}